

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O3

void luaL_openlib(lua_State *L,char *libname,luaL_Reg *l,int nup)

{
  char **ppcVar1;
  luaL_Reg *plVar2;
  int sizehint;
  
  if (libname != (char *)0x0) {
    sizehint = 0;
    if ((l != (luaL_Reg *)0x0) && (sizehint = 0, l->name != (char *)0x0)) {
      plVar2 = l + 1;
      sizehint = 0;
      do {
        sizehint = sizehint + 1;
        ppcVar1 = &plVar2->name;
        plVar2 = plVar2 + 1;
      } while (*ppcVar1 != (char *)0x0);
    }
    luaL_pushmodule(L,libname,sizehint);
    lua_insert(L,~nup);
  }
  if (l != (luaL_Reg *)0x0) {
    luaL_setfuncs(L,l,nup);
    return;
  }
  lua_settop(L,~nup);
  return;
}

Assistant:

LUALIB_API void luaL_openlib(lua_State *L, const char *libname,
			     const luaL_Reg *l, int nup)
{
  lj_lib_checkfpu(L);
  if (libname) {
    luaL_pushmodule(L, libname, libsize(l));
    lua_insert(L, -(nup + 1));  /* Move module table below upvalues. */
  }
  if (l)
    luaL_setfuncs(L, l, nup);
  else
    lua_pop(L, nup);  /* Remove upvalues. */
}